

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  
  determineReturnParams(&returnParams,this,&commandData->params);
  switch((long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) {
  case 0:
    generateCommandResultWithErrors0Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,raii);
    break;
  case 1:
    generateCommandResultSingleSuccessWithErrors1Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,
               *returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start,raii);
    break;
  case 2:
    generateCommandResultSingleSuccessWithErrors2Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,
               &returnParams,raii);
    break;
  case 3:
    generateCommandResultSingleSuccessWithErrors3Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,
               &returnParams,raii);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if (returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)returnParams.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)returnParams.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  std::vector<size_t> returnParams = determineReturnParams( commandData.params );
  switch ( returnParams.size() )
  {
    case 0 : return generateCommandResultWithErrors0Return( name, commandData, initialSkipCount, definition, raii );
    case 1 : return generateCommandResultSingleSuccessWithErrors1Return( name, commandData, initialSkipCount, definition, returnParams[0], raii );
    case 2 : return generateCommandResultSingleSuccessWithErrors2Return( name, commandData, initialSkipCount, definition, returnParams, raii );
    case 3 : return generateCommandResultSingleSuccessWithErrors3Return( name, commandData, initialSkipCount, definition, returnParams, raii );
    default: break;
  }
  return "";
}